

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::PointCoordCase::iterate(PointCoordCase *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  deInt32 dVar7;
  deInt32 dVar8;
  deInt32 dVar9;
  deInt32 dVar10;
  int iVar11;
  int iVar12;
  TestLog *log_00;
  RenderContext *pRVar13;
  undefined4 extraout_var;
  RenderTarget *pRVar15;
  TestError *pTVar16;
  pointer pVVar17;
  float *pfVar18;
  size_type sVar19;
  reference data;
  pointer pVVar20;
  char *description;
  float fVar21;
  float fVar22;
  RGBA local_44c;
  int iStack_448;
  bool isOk;
  int local_444;
  int dy;
  int dx;
  Vec4 color;
  float yf;
  float xf;
  int xo;
  int yo;
  int h;
  int w;
  int y1;
  int x1;
  int y0;
  int x0;
  __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
  local_400;
  __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
  local_3f8;
  const_iterator pointIter;
  PixelBufferAccess local_3e0;
  PixelBufferAccess local_3b8;
  PrimitiveList local_390;
  int local_374;
  int local_370;
  int viewportY;
  int viewportX;
  undefined1 local_348 [8];
  VertexArrayBinding posBinding;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  ProgramSources local_280;
  undefined1 local_1b0 [8];
  ShaderProgram program;
  __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
  local_d8;
  iterator coord;
  string local_c8;
  undefined1 local_a8 [8];
  Surface refImg;
  Surface testImg;
  Random rnd;
  float pointSizeRange [2];
  allocator<tcu::Vector<float,_3>_> local_49;
  undefined1 local_48 [8];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> coords;
  int numPoints;
  float threshold;
  int height;
  int width;
  Functions *gl;
  TestLog *log;
  PointCoordCase *this_local;
  long lVar14;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar13 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar13->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar3);
  pRVar15 = gles2::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = tcu::RenderTarget::getWidth(pRVar15);
  iVar3 = de::min<int>(0x100,iVar3);
  pRVar15 = gles2::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getHeight(pRVar15);
  iVar4 = de::min<int>(0x100,iVar4);
  coords.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x3ca3d70a;
  coords.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 8;
  std::allocator<tcu::Vector<float,_3>_>::allocator(&local_49);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_48,8,
             &local_49);
  std::allocator<tcu::Vector<float,_3>_>::~allocator(&local_49);
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  de::Random::Random((Random *)&testImg.m_pixels.m_cap,0x145fa);
  tcu::Surface::Surface((Surface *)&refImg.m_pixels.m_cap,iVar3,iVar4);
  tcu::Surface::Surface((Surface *)local_a8,iVar3,iVar4);
  (**(code **)(lVar14 + 0x818))(0x846d,&rnd.m_rnd.z);
  dVar5 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar5,"glGetFloatv(GL_ALIASED_POINT_SIZE_RANGE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderBuiltinVarTests.cpp"
                  ,0x1db);
  if ((((float)rnd.m_rnd.z <= 0.0) || ((float)rnd.m_rnd.w <= 0.0)) ||
     ((float)rnd.m_rnd.w < (float)rnd.m_rnd.z)) {
    coord._M_current._6_1_ = 1;
    pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Invalid GL_ALIASED_POINT_SIZE_RANGE",
               (allocator<char> *)((long)&coord._M_current + 7));
    tcu::TestError::TestError(pTVar16,&local_c8);
    coord._M_current._6_1_ = 0;
    __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  local_d8._M_current =
       (Vector<float,_3> *)
       std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::begin
                 ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_48
                 );
  while( true ) {
    program.m_program.m_info.linkTimeUs =
         (deUint64)
         std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::end
                   ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                    local_48);
    bVar2 = __gnu_cxx::operator!=
                      (&local_d8,
                       (__normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                        *)&program.m_program.m_info.linkTimeUs);
    if (!bVar2) break;
    fVar21 = de::Random::getFloat((Random *)&testImg.m_pixels.m_cap,-0.9,0.9);
    pVVar17 = __gnu_cxx::
              __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
              ::operator->(&local_d8);
    pfVar18 = tcu::Vector<float,_3>::x(pVVar17);
    *pfVar18 = fVar21;
    fVar21 = de::Random::getFloat((Random *)&testImg.m_pixels.m_cap,-0.9,0.9);
    pVVar17 = __gnu_cxx::
              __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
              ::operator->(&local_d8);
    pfVar18 = tcu::Vector<float,_3>::y(pVVar17);
    *pfVar18 = fVar21;
    fVar21 = de::Random::getFloat
                       ((Random *)&testImg.m_pixels.m_cap,(float)rnd.m_rnd.z,(float)rnd.m_rnd.w);
    pVVar17 = __gnu_cxx::
              __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
              ::operator->(&local_d8);
    pfVar18 = tcu::Vector<float,_3>::z(pVVar17);
    *pfVar18 = fVar21;
    __gnu_cxx::
    __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
    ::operator++(&local_d8);
  }
  pRVar13 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,
             "attribute highp vec3 a_positionSize;\nvoid main (void)\n{\n\tgl_Position = vec4(a_positionSize.xy, 0.0, 1.0);\n\tgl_PointSize = a_positionSize.z;\n}\n"
             ,&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,
             "void main (void)\n{\n\tgl_FragColor = vec4(gl_PointCoord, 0.0, 1.0);\n}\n",&local_2c9)
  ;
  glu::makeVtxFragSources(&local_280,&local_2a0,&local_2c8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1b0,pRVar13,&local_280);
  glu::ProgramSources::~ProgramSources(&local_280);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  glu::operator<<(log_00,(ShaderProgram *)local_1b0);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_1b0);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&viewportX,"a_positionSize",(allocator<char> *)((long)&viewportY + 3));
    sVar19 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                       ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        local_48);
    data = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                     ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                      local_48,0);
    glu::va::Float((VertexArrayBinding *)local_348,(string *)&viewportX,3,(int)sVar19,0,data->m_data
                  );
    std::__cxx11::string::~string((string *)&viewportX);
    std::allocator<char>::~allocator((allocator<char> *)((long)&viewportY + 3));
    pRVar15 = gles2::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar6 = tcu::RenderTarget::getWidth(pRVar15);
    local_370 = de::Random::getInt((Random *)&testImg.m_pixels.m_cap,0,iVar6 - iVar3);
    pRVar15 = gles2::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar6 = tcu::RenderTarget::getHeight(pRVar15);
    local_374 = de::Random::getInt((Random *)&testImg.m_pixels.m_cap,0,iVar6 - iVar4);
    (**(code **)(lVar14 + 0x1a00))(local_370,local_374,iVar3,iVar4);
    (**(code **)(lVar14 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar14 + 0x188))(0x4000);
    pcVar1 = *(code **)(lVar14 + 0x1680);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1b0);
    (*pcVar1)(dVar5);
    pRVar13 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1b0);
    sVar19 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                       ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        local_48);
    glu::pr::Points(&local_390,(int)sVar19);
    glu::draw(pRVar13,dVar5,1,(VertexArrayBinding *)local_348,&local_390,(DrawUtilCallback *)0x0);
    pRVar13 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
    iVar11 = local_370;
    iVar6 = local_374;
    tcu::Surface::getAccess(&local_3b8,(Surface *)&refImg.m_pixels.m_cap);
    glu::readPixels(pRVar13,iVar11,iVar6,&local_3b8);
    dVar5 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar5,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderBuiltinVarTests.cpp"
                    ,0x20d);
    glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_348);
    tcu::Surface::getAccess(&local_3e0,(Surface *)local_a8);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&pointIter,0.0,0.0,0.0,1.0);
    tcu::clear(&local_3e0,(Vec4 *)&pointIter);
    local_400._M_current =
         (Vector<float,_3> *)
         std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::begin
                   ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                    local_48);
    __gnu_cxx::
    __normal_iterator<tcu::Vector<float,3>const*,std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>
    ::__normal_iterator<tcu::Vector<float,3>*>
              ((__normal_iterator<tcu::Vector<float,3>const*,std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>
                *)&local_3f8,&local_400);
    while( true ) {
      _y0 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::end
                      ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                       local_48);
      bVar2 = __gnu_cxx::operator!=
                        (&local_3f8,
                         (__normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                          *)&y0);
      if (!bVar2) break;
      pVVar20 = __gnu_cxx::
                __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                ::operator->(&local_3f8);
      fVar21 = tcu::Vector<float,_3>::x(pVVar20);
      pVVar20 = __gnu_cxx::
                __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                ::operator->(&local_3f8);
      fVar22 = tcu::Vector<float,_3>::z(pVVar20);
      dVar7 = ::deRoundFloatToInt32((float)iVar3 * (fVar21 * 0.5 + 0.5) - fVar22 * 0.5);
      pVVar20 = __gnu_cxx::
                __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                ::operator->(&local_3f8);
      fVar21 = tcu::Vector<float,_3>::y(pVVar20);
      pVVar20 = __gnu_cxx::
                __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                ::operator->(&local_3f8);
      fVar22 = tcu::Vector<float,_3>::z(pVVar20);
      dVar8 = ::deRoundFloatToInt32((float)iVar4 * (fVar21 * 0.5 + 0.5) - fVar22 * 0.5);
      pVVar20 = __gnu_cxx::
                __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                ::operator->(&local_3f8);
      fVar21 = tcu::Vector<float,_3>::x(pVVar20);
      pVVar20 = __gnu_cxx::
                __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                ::operator->(&local_3f8);
      fVar22 = tcu::Vector<float,_3>::z(pVVar20);
      dVar9 = ::deRoundFloatToInt32((float)iVar3 * (fVar21 * 0.5 + 0.5) + fVar22 * 0.5);
      pVVar20 = __gnu_cxx::
                __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                ::operator->(&local_3f8);
      fVar21 = tcu::Vector<float,_3>::y(pVVar20);
      pVVar20 = __gnu_cxx::
                __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                ::operator->(&local_3f8);
      fVar22 = tcu::Vector<float,_3>::z(pVVar20);
      dVar10 = ::deRoundFloatToInt32((float)iVar4 * (fVar21 * 0.5 + 0.5) + fVar22 * 0.5);
      iVar6 = dVar10 - dVar8;
      for (xf = 0.0; (int)xf < iVar6; xf = (float)((int)xf + 1)) {
        for (yf = 0.0; (int)yf < dVar9 - dVar7; yf = (float)((int)yf + 1)) {
          color.m_data[3] = ((float)(int)yf + 0.5) / (float)(dVar9 - dVar7);
          color.m_data[2] = ((float)(int)(~(uint)xf + iVar6) + 0.5) / (float)iVar6;
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)&dy,color.m_data[3],color.m_data[2],0.0,1.0);
          iStack_448 = dVar8 + (int)xf;
          local_444 = dVar7 + (int)yf;
          iVar11 = tcu::Surface::getWidth((Surface *)local_a8);
          bVar2 = de::inBounds<int>(dVar7 + (int)yf,0,iVar11);
          iVar11 = iStack_448;
          if (bVar2) {
            iVar12 = tcu::Surface::getHeight((Surface *)local_a8);
            bVar2 = de::inBounds<int>(iVar11,0,iVar12);
            iVar12 = local_444;
            iVar11 = iStack_448;
            if (bVar2) {
              tcu::RGBA::RGBA(&local_44c,(Vec4 *)&dy);
              tcu::Surface::setPixel((Surface *)local_a8,iVar12,iVar11,local_44c);
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
      ::operator++(&local_3f8);
    }
    bVar2 = tcu::fuzzyCompare(log_00,"Result","Image comparison result",(Surface *)local_a8,
                              (Surface *)&refImg.m_pixels.m_cap,0.02,COMPARE_LOG_RESULT);
    description = "Image comparison failed";
    if (bVar2) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~bVar2 & QP_TEST_RESULT_FAIL,description);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1b0);
    tcu::Surface::~Surface((Surface *)local_a8);
    tcu::Surface::~Surface((Surface *)&refImg.m_pixels.m_cap);
    de::Random::~Random((Random *)&testImg.m_pixels.m_cap);
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_48);
    return STOP;
  }
  posBinding.pointer.data._6_1_ = 1;
  pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"Compile failed",
             (allocator<char> *)((long)&posBinding.pointer.data + 7));
  tcu::TestError::TestError(pTVar16,&local_2f0);
  posBinding.pointer.data._6_1_ = 0;
  __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const int				width		= de::min(256, m_context.getRenderTarget().getWidth());
		const int				height		= de::min(256, m_context.getRenderTarget().getHeight());
		const float				threshold	= 0.02f;

		const int				numPoints	= 8;

		vector<tcu::Vec3>		coords		(numPoints);
		float					pointSizeRange[2]	= { 0.0f, 0.0f };

		de::Random				rnd			(0x145fa);
		tcu::Surface			testImg		(width, height);
		tcu::Surface			refImg		(width, height);

		gl.getFloatv(GL_ALIASED_POINT_SIZE_RANGE, &pointSizeRange[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv(GL_ALIASED_POINT_SIZE_RANGE)");

		if (pointSizeRange[0] <= 0.0f || pointSizeRange[1] <= 0.0f || pointSizeRange[1] < pointSizeRange[0])
			throw tcu::TestError("Invalid GL_ALIASED_POINT_SIZE_RANGE");

		// Compute coordinates.
		{

			for (vector<tcu::Vec3>::iterator coord = coords.begin(); coord != coords.end(); ++coord)
			{
				coord->x() = rnd.getFloat(-0.9f, 0.9f);
				coord->y() = rnd.getFloat(-0.9f, 0.9f);
				coord->z() = rnd.getFloat(pointSizeRange[0], pointSizeRange[1]);
			}
		}

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(
			"attribute highp vec3 a_positionSize;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(a_positionSize.xy, 0.0, 1.0);\n"
			"	gl_PointSize = a_positionSize.z;\n"
			"}\n",

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(gl_PointCoord, 0.0, 1.0);\n"
			"}\n"));

		log << program;

		if (!program.isOk())
			throw tcu::TestError("Compile failed");

		// Draw with GL.
		{
			glu::VertexArrayBinding	posBinding	= glu::va::Float("a_positionSize", 3, (int)coords.size(), 0, (const float*)&coords[0]);
			const int				viewportX	= rnd.getInt(0, m_context.getRenderTarget().getWidth()-width);
			const int				viewportY	= rnd.getInt(0, m_context.getRenderTarget().getHeight()-height);

			gl.viewport(viewportX, viewportY, width, height);
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);

			gl.useProgram(program.getProgram());

			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Points((int)coords.size()));

			glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
		}

		// Draw reference
		tcu::clear(refImg.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		for (vector<tcu::Vec3>::const_iterator pointIter = coords.begin(); pointIter != coords.end(); ++pointIter)
		{
			const int	x0		= deRoundFloatToInt32(float(width) *(pointIter->x()*0.5f + 0.5f) - pointIter->z()*0.5f);
			const int	y0		= deRoundFloatToInt32(float(height)*(pointIter->y()*0.5f + 0.5f) - pointIter->z()*0.5f);
			const int	x1		= deRoundFloatToInt32(float(width) *(pointIter->x()*0.5f + 0.5f) + pointIter->z()*0.5f);
			const int	y1		= deRoundFloatToInt32(float(height)*(pointIter->y()*0.5f + 0.5f) + pointIter->z()*0.5f);
			const int	w		= x1-x0;
			const int	h		= y1-y0;

			for (int yo = 0; yo < h; yo++)
			{
				for (int xo = 0; xo < w; xo++)
				{
					const float			xf		= (float(xo)+0.5f) / float(w);
					const float			yf		= (float(h-yo-1)+0.5f) / float(h);
					const tcu::Vec4		color	(xf, yf, 0.0f, 1.0f);
					const int			dx		= x0+xo;
					const int			dy		= y0+yo;

					if (de::inBounds(dx, 0, refImg.getWidth()) && de::inBounds(dy, 0, refImg.getHeight()))
						refImg.setPixel(dx, dy, tcu::RGBA(color));
				}
			}
		}

		// Compare
		{
			bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}